

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::log_message(ConsoleReporter *this,MessageData *mb)

{
  ostream *poVar1;
  char *pcVar2;
  long in_RSI;
  ConsoleReporter *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffa8;
  ostream *in_stack_ffffffffffffffb0;
  ConsoleReporter *in_stack_ffffffffffffffb8;
  ConsoleReporter *this_00;
  ConsoleReporter *in_stack_ffffffffffffffe0;
  
  if ((in_RDI->tc->m_no_output & 1U) == 0) {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    logTestStart(in_stack_ffffffffffffffe0);
    (*(in_RDI->super_IReporter)._vptr_IReporter[0xe])
              (in_RDI,*(undefined8 *)(in_RSI + 0x18),(ulong)*(uint *)(in_RSI + 0x20)," ");
    this_00 = (ConsoleReporter *)in_RDI->s;
    getSuccessOrFailColor(in_RDI,false,*(Enum *)(in_RSI + 0x24));
    poVar1 = Color::operator<<(in_stack_ffffffffffffffb0,
                               (Enum)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    pcVar2 = getSuccessOrFailString
                       (in_stack_ffffffffffffffb8,SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x38,0),
                        (Enum)in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::operator<<(poVar1,": ");
    poVar1 = Color::operator<<(in_stack_ffffffffffffffb0,
                               (Enum)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    poVar1 = doctest::operator<<(poVar1,(String *)in_stack_ffffffffffffffa8);
    std::operator<<(poVar1,"\n");
    log_contexts(this_00);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x11e9d2);
  }
  return;
}

Assistant:

void log_message(const MessageData& mb) override {
            if(tc->m_no_output)
                return;

            std::lock_guard<std::mutex> lock(mutex);

            logTestStart();

            file_line_to_stream(mb.m_file, mb.m_line, " ");
            s << getSuccessOrFailColor(false, mb.m_severity)
              << getSuccessOrFailString(mb.m_severity & assertType::is_warn, mb.m_severity,
                                        "MESSAGE") << ": ";
            s << Color::None << mb.m_string << "\n";
            log_contexts();
        }